

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void Cmd_listmaps(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  int wadnum;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined1 local_38 [16];
  MapData *map;
  level_info_t *info;
  uint i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  info._4_4_ = key;
  _i = (char *)who;
  who_local = (APlayerPawn *)argv;
  for (info._0_4_ = 0; uVar2 = (uint)info,
      uVar3 = TArray<level_info_t,_level_info_t>::Size(&wadlevelinfos), uVar2 < uVar3;
      info._0_4_ = (uint)info + 1) {
    map = (MapData *)
          TArray<level_info_t,_level_info_t>::operator[](&wadlevelinfos,(ulong)(uint)info);
    pcVar4 = FString::operator_cast_to_char_(&((level_info_t *)map)->MapName);
    local_38._8_8_ = P_OpenMapData(pcVar4,true);
    if ((MapData *)local_38._8_8_ != (MapData *)0x0) {
      pcVar4 = FString::GetChars((FString *)&map->MapLumps[0].Reader);
      level_info_t::LookupLevelName((level_info_t *)local_38);
      pcVar5 = FString::GetChars((FString *)local_38);
      wadnum = FWadCollection::GetLumpFile(&Wads,*(int *)(local_38._8_8_ + 0xd4));
      pcVar6 = FWadCollection::GetWadName(&Wads,wadnum);
      Printf("%s: \'%s\' (%s)\n",pcVar4,pcVar5,pcVar6);
      FString::~FString((FString *)local_38);
      uVar1 = local_38._8_8_;
      if ((MapData *)local_38._8_8_ != (MapData *)0x0) {
        MapData::~MapData((MapData *)local_38._8_8_);
        operator_delete((void *)uVar1,0xe8);
      }
    }
  }
  return;
}

Assistant:

CCMD(listmaps)
{
	for(unsigned i = 0; i < wadlevelinfos.Size(); i++)
	{
		level_info_t *info = &wadlevelinfos[i];
		MapData *map = P_OpenMapData(info->MapName, true);

		if (map != NULL)
		{
			Printf("%s: '%s' (%s)\n", info->MapName.GetChars(), info->LookupLevelName().GetChars(),
				Wads.GetWadName(Wads.GetLumpFile(map->lumpnum)));
			delete map;
		}
	}
}